

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O1

uint32_t __thiscall cfd::core::Transaction::GetTxInIndex(Transaction *this,Txid *txid,uint32_t vout)

{
  bool bVar1;
  uint32_t uVar2;
  CfdException *this_00;
  long lVar3;
  pointer pTVar4;
  ulong unaff_R12;
  bool bVar5;
  string local_58;
  Txid *local_38;
  
  pTVar4 = (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
           _M_impl.super__Vector_impl_data._M_start;
  bVar5 = (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl
          .super__Vector_impl_data._M_finish != pTVar4;
  local_38 = txid;
  if (bVar5) {
    lVar3 = 0;
    unaff_R12 = 0;
    do {
      AbstractTxIn::GetTxid
                ((Txid *)&local_58,
                 (AbstractTxIn *)((long)&(pTVar4->super_AbstractTxIn)._vptr_AbstractTxIn + lVar3));
      bVar1 = Txid::Equals((Txid *)&local_58,local_38);
      if (bVar1) {
        uVar2 = AbstractTxIn::GetVout
                          ((AbstractTxIn *)
                           ((long)&(((this->vin_).
                                     super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxIn)
                                   ._vptr_AbstractTxIn + lVar3));
        local_58._M_dataplus._M_p = (pointer)&PTR__Txid_00735400;
        if ((void *)CONCAT44(local_58._M_string_length._4_4_,(undefined4)local_58._M_string_length)
            != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_58._M_string_length._4_4_,
                                           (undefined4)local_58._M_string_length));
        }
        if (uVar2 == vout) break;
      }
      else {
        local_58._M_dataplus._M_p = (pointer)&PTR__Txid_00735400;
        if ((void *)CONCAT44(local_58._M_string_length._4_4_,(undefined4)local_58._M_string_length)
            != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_58._M_string_length._4_4_,
                                           (undefined4)local_58._M_string_length));
        }
      }
      unaff_R12 = unaff_R12 + 1;
      pTVar4 = (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x90;
      bVar5 = unaff_R12 <
              (ulong)(((long)(this->vin_).
                             super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pTVar4 >> 4) *
                     -0x71c71c71c71c71c7);
    } while (bVar5);
  }
  if (!bVar5) {
    local_58._M_dataplus._M_p = "cfdcore_transaction.cpp";
    local_58._M_string_length._0_4_ = 0x201;
    local_58.field_2._M_allocated_capacity = (long)"CfdGetTxInIndex" + 3;
    logger::log<>((CfdSourceLocation *)&local_58,kCfdLogLevelWarning,"Txid is not found.");
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Txid is not found.","");
    CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_58);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return (uint32_t)unaff_R12;
}

Assistant:

uint32_t Transaction::GetTxInIndex(const Txid &txid, uint32_t vout) const {
  for (size_t i = 0; i < vin_.size(); ++i) {
    if (vin_[i].GetTxid().Equals(txid) && vin_[i].GetVout() == vout) {
      return static_cast<uint32_t>(i);
    }
  }
  warn(CFD_LOG_SOURCE, "Txid is not found.");
  throw CfdException(kCfdIllegalArgumentError, "Txid is not found.");
}